

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall kratos::Param::value_str_abi_cxx11_(string *__return_storage_ptr__,Param *this)

{
  Param *pPVar1;
  Param *p;
  _Alloc_hider _Var2;
  size_type sVar3;
  
  if (this->param_type_ == Integral) {
    Const::to_string_abi_cxx11_(__return_storage_ptr__,&this->super_Const);
    return __return_storage_ptr__;
  }
  pPVar1 = this->parent_param_;
  if (pPVar1 != (Param *)0x0) {
    (*(pPVar1->super_Const).super_Var.super_IRNode._vptr_IRNode[0x1f])
              (__return_storage_ptr__,pPVar1);
    return __return_storage_ptr__;
  }
  if (this->param_type_ == RawType) {
    if ((this->raw_str_value_).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      _Var2._M_p = (this->raw_str_value_).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      sVar3 = (this->raw_str_value_).
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length;
      goto LAB_001a85f3;
    }
    if ((this->initial_raw_str_value_).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      _Var2._M_p = (this->initial_raw_str_value_).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      sVar3 = (this->initial_raw_str_value_).
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length;
      goto LAB_001a85f3;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  _Var2._M_p = (this->super_Const).super_Var.name._M_dataplus._M_p;
  sVar3 = (this->super_Const).super_Var.name._M_string_length;
LAB_001a85f3:
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,_Var2._M_p,_Var2._M_p + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string Param::value_str() const {
    if (param_type_ == ParamType::Integral) {
        return Const::to_string();
    } else if (parent_param_) {
        const auto *p = parent_param();
        return p->to_string();
    } else {
        // raw type
        if (param_type_ == ParamType::RawType) {
            if (raw_str_value_) return *raw_str_value_;
            if (initial_raw_str_value_) return *initial_raw_str_value_;
        }
        return name;
    }
}